

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

void ODDLParser::OpenDDLParser::normalizeBuffer(vector<char,_std::allocator<char>_> *buffer)

{
  char *pcVar1;
  char *end;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  vector<char,_std::allocator<char>_> newBuffer;
  
  pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  end = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish;
  if (pcVar1 != end) {
    newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    newBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (uVar5 = 0; uVar5 < (ulong)((long)end - (long)pcVar1); uVar5 = uVar5 + 1) {
      pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = pcVar2 + uVar5;
      if (((pcVar2[uVar5] == '/') && (pcVar6 + 1 != end)) && (pcVar6[1] == '*')) {
        lVar4 = -3 - uVar5;
        for (pcVar6 = pcVar2 + uVar5 + 2;
            ((pcVar6[-1] != '*' || (pcVar6 == end)) || (*pcVar6 != '/')); pcVar6 = pcVar6 + 1) {
          lVar4 = lVar4 + -1;
        }
        uVar5 = -lVar4;
      }
      else {
        bVar3 = isComment<char>(pcVar6,end);
        if (((bVar3) || (*pcVar6 == '\n')) || (*pcVar6 == '\r')) {
          bVar3 = isComment<char>(pcVar6,end);
          if (bVar3) {
            uVar7 = uVar5;
            do {
              uVar5 = uVar7 + 1;
              lVar4 = uVar7 + 1;
              uVar7 = uVar5;
            } while ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar4] != '\n');
          }
        }
        else {
          std::vector<char,_std::allocator<char>_>::push_back
                    (&newBuffer,
                     (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar5);
        }
      }
    }
    std::vector<char,_std::allocator<char>_>::operator=(buffer,&newBuffer);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&newBuffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  return;
}

Assistant:

const char *OpenDDLParser::getVersion() {
    return Version;
}